

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToMillenniaOperator::Operation<int,duckdb::interval_t>(int input)

{
  interval_t iVar1;
  bool bVar2;
  int iVar3;
  OutOfRangeException *this;
  allocator local_69;
  interval_t result;
  string local_58;
  string local_38;
  
  iVar3 = Cast::Operation<int,int>(input);
  result.days = 0;
  result.micros = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<int,int,int>(iVar3,12000,&result.months);
  if (bVar2) {
    iVar1.days = result.days;
    iVar1.months = result.months;
    iVar1.micros = result.micros;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Interval value %s millennia out of range",&local_69);
  std::__cxx11::to_string(&local_58,input);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_MILLENIUM,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %s millennia out of range", NumericHelper::ToString(input));
		}
		return result;
	}